

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

int __thiscall cmVSLink::Link(cmVSLink *this)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  if ((this->Incremental == true) &&
     ((this->LinkGeneratesManifest != false ||
      ((this->UserManifests).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->UserManifests).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)))) {
    if (this->Verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Visual Studio Incremental Link with embedded manifests\n",
                 0x37);
    }
    iVar1 = LinkIncremental(this);
    return iVar1;
  }
  if (this->Verbose == true) {
    if (this->Incremental == false) {
      pcVar3 = "Visual Studio Non-Incremental Link\n";
      lVar2 = 0x23;
    }
    else {
      pcVar3 = "Visual Studio Incremental Link without manifests\n";
      lVar2 = 0x31;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  }
  iVar1 = LinkNonIncremental(this);
  return iVar1;
}

Assistant:

int cmVSLink::Link()
{
  if (this->Incremental &&
      (this->LinkGeneratesManifest || !this->UserManifests.empty())) {
    if (this->Verbose) {
      std::cout << "Visual Studio Incremental Link with embedded manifests\n";
    }
    return LinkIncremental();
  }
  if (this->Verbose) {
    if (!this->Incremental) {
      std::cout << "Visual Studio Non-Incremental Link\n";
    } else {
      std::cout << "Visual Studio Incremental Link without manifests\n";
    }
  }
  return LinkNonIncremental();
}